

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::TrySetFrameObjectInHeapArgObj
          (InterpreterStackFrame *this,ScriptContext *scriptContext,bool hasNonSimpleParams,
          bool isScopeObjRestored)

{
  HeapArgumentsObject *pHVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RecyclableObject *instance;
  undefined8 uVar5;
  JavascriptFunction *funcCallee;
  char useCachedScope;
  undefined7 in_register_00000009;
  char16_t *form;
  long *plVar6;
  HeapArgumentsObject *this_00;
  Type local_60;
  Type literalType;
  PropertyIdArray *local_40;
  uint32 local_34;
  
  literalType.ptr._4_4_ = (undefined4)CONCAT71(in_register_00000009,isScopeObjRestored);
  pHVar1 = *(HeapArgumentsObject **)(this + 0x40);
  this_00 = (HeapArgumentsObject *)0x0;
  if ((pHVar1 != (HeapArgumentsObject *)0x0) &&
     ((pHVar1->frameObject).ptr == (ActivationObject *)0x0)) {
    this_00 = pHVar1;
  }
  local_34 = ((*(FunctionBody **)(this + 0x88))->super_ParseableFunctionInfo).m_inParamCount - 1;
  bVar3 = FunctionBody::NeedScopeObjectForArguments
                    (*(FunctionBody **)(this + 0x88),hasNonSimpleParams);
  if (bVar3) {
    instance = *(RecyclableObject **)(this + 0x58);
    useCachedScope = (*(FunctionBody **)(this + 0x88))->hasCachedScopePropIds;
    local_40 = FunctionBody::GetFormalsPropIdArray(*(FunctionBody **)(this + 0x88),true);
    if ((literalType.ptr._4_1_ == '\0') || (bVar3 = VarIs<Js::ActivationObject>(instance), !bVar3))
    {
      if ((Type)useCachedScope == false) {
        instance = (RecyclableObject *)
                   JavascriptOperators::OP_NewScopeObject(*(ScriptContext **)(this + 0x78));
      }
      else {
        local_60.ptr = (DynamicType *)0x0;
        if ((hasNonSimpleParams | local_40->hasNonSimpleParams) == 1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0x2523,
                                      "(!propIds->hasNonSimpleParams && !hasNonSimpleParams)",
                                      "!propIds->hasNonSimpleParams && !hasNonSimpleParams");
          if (!bVar3) goto LAB_00a56ee4;
          *puVar4 = 0;
        }
        instance = (RecyclableObject *)
                   JavascriptOperators::OP_InitCachedScope
                             (*(Var *)(this + 0x80),local_40,&local_60,hasNonSimpleParams,
                              scriptContext);
      }
      if (local_40 == (PropertyIdArray *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x252a,"(propIds != nullptr)","propIds != nullptr");
        if (!bVar3) goto LAB_00a56ee4;
        *puVar4 = 0;
      }
      *(RecyclableObject **)(this + 0x58) = instance;
      bVar3 = Phases::IsEnabled((Phases *)&DAT_015cd718,StackArgFormalsOptPhase);
      if (((bVar3) && (DAT_015d346a == '\x01')) &&
         (plVar6 = *(long **)(this + 0x88), 1 < *(ushort *)(plVar6 + 10))) {
        form = L"StackArgFormals : %s (%d) :Creating scope object in the bail out path. \n";
        goto LAB_00a56d7d;
      }
    }
    else {
      if ((*(byte *)(*(long *)(this + 0x88) + 0x46) & 0x40) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x2516,"(this->GetFunctionBody()->GetDoScopeObjectCreation())",
                                    "this->GetFunctionBody()->GetDoScopeObjectCreation()");
        if (!bVar3) goto LAB_00a56ee4;
        *puVar4 = 0;
      }
      bVar3 = Phases::IsEnabled((Phases *)&DAT_015cd718,StackArgFormalsOptPhase);
      useCachedScope = true;
      if ((bVar3) && (DAT_015d346a == '\x01')) {
        plVar6 = *(long **)(this + 0x88);
        useCachedScope = true;
        if (1 < *(ushort *)(plVar6 + 10)) {
          form = 
          L"StackArgFormals : %s (%d) :Using the restored scope object in the bail out path. \n";
          goto LAB_00a56d7d;
        }
      }
    }
  }
  else {
    if ((local_34 != 0) &&
       (((hasNonSimpleParams | *(byte *)(*(long *)(this + 0x88) + 0x46)) & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x2537,
                                  "(formalsCount == 0 || (m_functionBody->GetIsStrictMode() || hasNonSimpleParams))"
                                  ,
                                  "formalsCount == 0 || (m_functionBody->GetIsStrictMode() || hasNonSimpleParams)"
                                 );
      if (!bVar3) goto LAB_00a56ee4;
      *puVar4 = 0;
    }
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015cd718,StackArgOptPhase);
    if ((bVar3) && (DAT_015d346a == '\x01')) {
      plVar6 = *(long **)(this + 0x88);
      instance = (RecyclableObject *)0x0;
      form = L"StackArgOpt : %s (%d) :Creating NULL scope object in the bail out path. \n";
      local_34 = 0;
      local_40 = (PropertyIdArray *)0x0;
      useCachedScope = '\0';
LAB_00a56d7d:
      uVar5 = (**(code **)(*plVar6 + 0x38))();
      Output::Print(form,uVar5,(ulong)*(uint *)(*(long *)(this + 0x88) + 0x40));
      Output::Flush();
    }
    else {
      instance = (RecyclableObject *)0x0;
      local_34 = 0;
      local_40 = (PropertyIdArray *)0x0;
      useCachedScope = false;
    }
  }
  if (this_00 != (HeapArgumentsObject *)0x0) {
    if ((instance != (RecyclableObject *)0x0) &&
       (((ulong)instance >> 0x30 != 0 || (bVar3 = VarIsImpl<Js::ActivationObject>(instance), !bVar3)
        ))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x2544,
                                  "(frameObject == nullptr || VarIs<ActivationObject>(frameObject))"
                                  ,"frameObject == nullptr || VarIs<ActivationObject>(frameObject)")
      ;
      if (!bVar3) {
LAB_00a56ee4:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    this_00->formalCount = local_34;
    HeapArgumentsObject::SetFrameObject(this_00,(ActivationObject *)instance);
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015cd718,StackArgFormalsOptPhase);
    if ((bVar3) && (local_34 != 0)) {
      uVar5 = (**(code **)(**(long **)(this + 0x88) + 0x38))();
      Output::Print(L"StackArgFormals : %s (%d) :Attaching the scope object with the heap arguments object in the bail out path. \n"
                    ,uVar5,(ulong)*(uint *)(*(long *)(this + 0x88) + 0x40));
      Output::Flush();
    }
  }
  funcCallee = (JavascriptFunction *)(**(code **)(**(long **)(this + 0x80) + 0x3d0))();
  JavascriptOperators::FillScopeObject
            (funcCallee,*(int *)(this + 0x18) - 1,local_34,instance,
             (Var *)(*(long *)(this + 0x20) + 8),local_40,this_00,scriptContext,hasNonSimpleParams,
             (bool)useCachedScope);
  return;
}

Assistant:

void InterpreterStackFrame::TrySetFrameObjectInHeapArgObj(ScriptContext * scriptContext, bool hasNonSimpleParams, bool isScopeObjRestored)
    {
        Var frameObject = nullptr;

        uint32 formalsCount = this->m_functionBody->GetInParamsCount() - 1;
        Js::PropertyIdArray * propIds = nullptr;
        Js::HeapArgumentsObject* heapArgObj = nullptr;

        //We always set the Frame object to nullptr in BailOutRecord::EnsureArguments for stack args optimization.
        if (m_arguments != nullptr && ((Js::HeapArgumentsObject*)(m_arguments))->GetFrameObject() == nullptr)
        {
            heapArgObj = (Js::HeapArgumentsObject*)m_arguments;
        }

        bool isCachedScope = false;

        //For Non-simple params, we don't have a scope object created.
        if (this->m_functionBody->NeedScopeObjectForArguments(hasNonSimpleParams))
        {
            frameObject = GetLocalClosure();

            isCachedScope = m_functionBody->HasCachedScopePropIds();
            propIds = this->m_functionBody->GetFormalsPropIdArray();

            if (isScopeObjRestored && VarIs<ActivationObject>(frameObject))
            {
                Assert(this->GetFunctionBody()->GetDoScopeObjectCreation());
                isCachedScope = true;
                if (PHASE_VERBOSE_TRACE1(Js::StackArgFormalsOptPhase) && m_functionBody->GetInParamsCount() > 1)
                {
                    Output::Print(_u("StackArgFormals : %s (%d) :Using the restored scope object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                    Output::Flush();
                }
            }
            else
            {
                if (isCachedScope)
                {
                    Field(DynamicType*) literalType = nullptr;
                    Assert(!propIds->hasNonSimpleParams && !hasNonSimpleParams);
                    frameObject = JavascriptOperators::OP_InitCachedScope(this->GetJavascriptFunction(), propIds, &literalType, hasNonSimpleParams, scriptContext);
                }
                else
                {
                    frameObject = JavascriptOperators::OP_NewScopeObject(GetScriptContext());
                }
                Assert(propIds != nullptr);
                SetLocalClosure(frameObject);

                if (PHASE_VERBOSE_TRACE1(Js::StackArgFormalsOptPhase) && m_functionBody->GetInParamsCount() > 1)
                {
                    Output::Print(_u("StackArgFormals : %s (%d) :Creating scope object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                    Output::Flush();
                }
            }
        }
        else
        {
            //We reached here because, either we don't have any formals or we don't have a scope object (it could be in strict mode or have non-simple param list)
            Assert(formalsCount == 0 || (m_functionBody->GetIsStrictMode() || hasNonSimpleParams));
            frameObject = nullptr;
            formalsCount = 0;

            if (PHASE_VERBOSE_TRACE1(Js::StackArgOptPhase))
            {
                Output::Print(_u("StackArgOpt : %s (%d) :Creating NULL scope object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                Output::Flush();
            }
        }

        if (heapArgObj)
        {
            Assert(frameObject == nullptr || VarIs<ActivationObject>(frameObject));
            heapArgObj->SetFormalCount(formalsCount);
            heapArgObj->SetFrameObject(frameObject != nullptr ?
                static_cast<ActivationObject*>(frameObject) : nullptr);

            if (PHASE_TRACE1(Js::StackArgFormalsOptPhase) && formalsCount > 0)
            {
                Output::Print(_u("StackArgFormals : %s (%d) :Attaching the scope object with the heap arguments object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                Output::Flush();
            }
        }

        //Fill the Heap arguments and scope object with values
        // If there is no heap arguments object, then fill only the scope object with actuals.
        JavascriptOperators::FillScopeObject(this->function->GetRealFunctionObject(), this->m_inSlotsCount - 1, formalsCount, frameObject, &this->m_inParams[1], propIds, heapArgObj, scriptContext, hasNonSimpleParams, isCachedScope);
    }